

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.hpp
# Opt level: O3

Const_Proxy_Function __thiscall
chaiscript::bootstrap::Bootstrap::get_guard(Bootstrap *this,Const_Proxy_Function *t_pf)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  long lVar2;
  runtime_error *this_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  long lVar4;
  undefined1 auVar5 [16];
  Const_Proxy_Function CVar6;
  
  peVar1 = (t_pf->
           super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  if (peVar1 == (element_type *)0x0) {
LAB_00290f42:
    this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_02,"Function does not have a guard");
    __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  auVar5 = __dynamic_cast(peVar1,&dispatch::Proxy_Function_Base::typeinfo,
                          &dispatch::Dynamic_Proxy_Function::typeinfo,0);
  _Var3._M_pi = auVar5._8_8_;
  lVar2 = auVar5._0_8_;
  if (lVar2 == 0) goto LAB_00290f42;
  this_00 = (t_pf->
            super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
            )._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  lVar4 = *(long *)(lVar2 + 0x48);
  this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar2 + 0x50);
  if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (lVar4 == 0) goto LAB_00290f42;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    if (lVar4 == 0) goto LAB_00290f42;
    lVar4 = *(long *)(lVar2 + 0x48);
    lVar2 = *(long *)(lVar2 + 0x50);
    _Var3._M_pi = extraout_RDX;
    if (lVar2 != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 1;
      }
      goto LAB_00290f19;
    }
  }
  lVar2 = 0;
LAB_00290f19:
  *(long *)this = lVar4;
  *(long *)(this + 8) = lVar2;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    _Var3._M_pi = extraout_RDX_00;
  }
  CVar6.
  super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var3._M_pi;
  CVar6.
  super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (Const_Proxy_Function)
         CVar6.
         super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

static Const_Proxy_Function get_guard(const Const_Proxy_Function &t_pf) {
      const auto pf = std::dynamic_pointer_cast<const dispatch::Dynamic_Proxy_Function>(t_pf);
      if (pf && pf->get_guard()) {
        return pf->get_guard();
      } else {
        throw std::runtime_error("Function does not have a guard");
      }
    }